

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.c
# Opt level: O2

int main(int ac,char **av)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  tdef *ptVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  force = 0;
  insert_segments = 0;
  delete_segments = 0;
  insert_orders_segment = 0;
  insert_lineitem_segment = 0;
  delete_segment = 0;
  verbose = 0;
  columnar = 0;
  set_seeds = 0;
  header = 0;
  direct = 0;
  updates = 0;
  table = 0x3d;
  step = -1;
  flt_scale = 1.0;
  tdefs[5].base = tdefs[5].base * 10;
  fnames = 0;
  scale = 1;
  db_name = (char *)0x0;
  refresh = 10;
  gen_sql = 0;
  gen_rng = 0;
  children = 1;
  d_path = (char *)0x0;
  process_options(ac,av);
  if (-1 < verbose) {
    fprintf(_stderr,"%s Population Generator (Version %d.%d.%d%s)\n","SSB (Star Schema Benchmark)",1
            ,0,0,"");
    fprintf(_stderr,"Copyright %s %s\n","Transaction Processing Performance Council","1994 - 2000");
  }
  load_dists();
  tdefs[8].base = (long)nations.count;
  tdefs[9].base = (long)regions.count;
  if (updates != 0) {
    set_state(5,scale,1,2,(long *)&stack0xffffffffffffffcc);
    rowcnt = (int_least64_t)
             (int)((double)refresh * (double)scale * ((double)tdefs[5].base / 10000.0));
    if (step < 1) {
      upd_num = 0;
    }
    else {
      sd_order(0,rowcnt * (ulong)(step - 1));
      sd_line(0,((long)step + -1) * rowcnt);
      upd_num = (long)step + -1;
    }
    for (; upd_num < updates; upd_num = upd_num + 1) {
      if (0 < verbose) {
        fprintf(_stderr,"Generating update pair #%ld for %s [pid: %d]",upd_num + 1,tdefs[5].comment,
                1);
      }
      insert_orders_segment = 0;
      insert_lineitem_segment = 0;
      delete_segment = 0;
      minrow = rowcnt * upd_num + 1;
      gen_tbl(5,minrow,rowcnt,upd_num + 1);
      if (0 < verbose) {
        fwrite("done.\n",6,1,_stderr);
      }
      pr_drange(5,minrow,rowcnt,upd_num + 1);
    }
    exit(0);
  }
  if (direct == 0) {
    if (fnames != 0) {
      for (uVar4 = 0; uVar4 != 10; uVar4 = uVar4 + 1) {
        if ((((uint)table >> (uVar4 & 0x1f) & 1) != 0) && (iVar1 = set_files(uVar4,-1), iVar1 != 0))
        {
          fwrite("Load aborted!\n",0xe,1,_stderr);
          exit(1);
        }
      }
    }
  }
  else {
    prep_direct();
  }
  ptVar5 = tdefs;
  uVar6 = 0;
  do {
    if (uVar6 == 10) {
      if (direct != 0) {
        close_direct();
      }
      return 0;
    }
    uVar4 = (uint)uVar6;
    if (((uint)table >> (uVar4 & 0x1f) & 1) != 0) {
      if ((uVar6 < 8) && (1 < children)) {
        if (step < 0) {
          if (validate != 0) goto LAB_00105246;
          pload(uVar4);
        }
        else {
          if (validate != 0) {
LAB_00105246:
            fputs("Cannot validate parallel data generation",_stderr);
            abort();
          }
          partial(uVar4,step);
        }
      }
      else {
        minrow = 1;
        lVar2 = ptVar5->base;
        if ((uVar6 < 8) && (rowcnt = ptVar5->base * scale, lVar2 = tdefs[4].base, uVar4 != 4)) {
          if (uVar4 == 0) {
            dVar7 = (double)tdefs[0].base;
            dVar8 = log((double)scale);
            dVar8 = floor(dVar8 / 0.6931471805599453 + 1.0);
            lVar2 = tdefs[4].base;
            rowcnt = (long)(dVar8 * dVar7);
            if (uVar6 == 4) goto LAB_001050d3;
          }
        }
        else {
LAB_001050d3:
          rowcnt = lVar2;
        }
        if (0 < verbose) {
          pcVar3 = "Validating";
          if (validate == 0) {
            pcVar3 = "Generating";
          }
          fprintf(_stderr,"%s data for %s [pid: %d]: ",pcVar3,ptVar5->comment,1);
        }
        gen_tbl(uVar4,minrow,rowcnt,upd_num);
        if (0 < verbose) {
          fwrite("done.\n",6,1,_stderr);
        }
      }
      if (validate != 0) {
        printf("Validation checksum for %s at %ld GB: %0lx\n",ptVar5->name,scale,ptVar5->vtotal);
      }
    }
    uVar6 = uVar6 + 1;
    ptVar5 = ptVar5 + 1;
  } while( true );
}

Assistant:

int
main (int ac, char **av)
{
	int i;

	table =
#ifdef SSB
		(1 << CUST) |
		(1 << PART) |
		(1 << SUPP) |
		(1 << DATE) |
		(1 << LINE);
#else
		(1 << CUST) |
		(1 << SUPP) |
		(1 << NATION) |
		(1 << REGION) |
		(1 << PART_PSUPP) |
		(1 << ORDER_LINE);
#endif
	force = 0;
	insert_segments=0;
	delete_segments=0;
	insert_orders_segment=0;
	insert_lineitem_segment=0;
	delete_segment=0;
	verbose = 0;
	columnar = 0;
	set_seeds = 0;
	header = 0;
	direct = 0;
	scale = 1;
	flt_scale = 1.0;
	updates = 0;
	refresh = UPD_PCT;
	step = -1;
#ifdef SSB
	tdefs[LINE].base *=
		ORDERS_PER_CUST;			/* have to do this after init */
#else
	tdefs[ORDER].base *=
		ORDERS_PER_CUST;			/* have to do this after init */
	tdefs[LINE].base *=
		ORDERS_PER_CUST;			/* have to do this after init */
	tdefs[ORDER_LINE].base *=
		ORDERS_PER_CUST;			/* have to do this after init */
#endif
	fnames = 0;
	db_name = NULL;
	gen_sql = 0;
	gen_rng = 0;
	children = 1;
	d_path = NULL;

	process_options (ac, av);
#if ( defined(WIN32) && !defined(_POSIX_C_SOURCE) )
	for (i = 0; i < ac; i++)
	{
		spawn_args[i] = malloc ((strlen (av[i]) + 1) * sizeof (char));
		MALLOC_CHECK (spawn_args[i]);
		strcpy (spawn_args[i], av[i]);
	}
	spawn_args[ac] = NULL;
#endif

	if (verbose >= 0)
		{
		fprintf (stderr,
			"%s Population Generator (Version %d.%d.%d%s)\n",
			NAME, VERSION, RELEASE, MODIFICATION, PATCH);
		fprintf (stderr, "Copyright %s %s\n", TPC, C_DATES);
		}

	load_dists ();
	/* have to do this after init */
	tdefs[NATION].base = nations.count;
	tdefs[REGION].base = regions.count;

	/*
	* updates are never parallelized
	*/
	if (updates)
		{
		/*
		 * set RNG to start generating rows beyond SF=scale
		 */
		double fix1;

#ifdef SSB
		set_state (LINE, scale, 1, 2, (long *)&i);
		fix1 = (double)tdefs[LINE].base / (double)10000; /*represent the %% percentage (n/100)%*/
#else
		set_state (ORDER, scale, 1, 2, (long *)&i);
		fix1 = (double)tdefs[ORDER_LINE].base / (double)10000;
#endif
		rowcnt = (int)(fix1 * scale * refresh);
		if (step > 0)
			{
			/*
			 * adjust RNG for any prior update generation
			 */
			sd_order(0, rowcnt * (step - 1));
			sd_line(0, rowcnt * (step - 1));
			upd_num = step - 1;
			}
		else
			upd_num = 0;

		while (upd_num < updates)
			{
			if (verbose > 0)
#ifdef SSB
				fprintf (stderr,
				"Generating update pair #%ld for %s [pid: %d]",
				upd_num + 1, tdefs[LINE].comment, DSS_PROC);
#else
				fprintf (stderr,
				"Generating update pair #%ld for %s [pid: %d]",
				upd_num + 1, tdefs[ORDER_LINE].comment, DSS_PROC);

#endif
			insert_orders_segment=0;
			insert_lineitem_segment=0;
			delete_segment=0;
			minrow = upd_num * rowcnt + 1;
#ifdef SSB
			gen_tbl (LINE, minrow, rowcnt, upd_num + 1);
#else
			gen_tbl (ORDER_LINE, minrow, rowcnt, upd_num + 1);
#endif
			if (verbose > 0)
				fprintf (stderr, "done.\n");
#ifdef SSB
			pr_drange (LINE, minrow, rowcnt, upd_num + 1);
#else
			pr_drange (ORDER_LINE, minrow, rowcnt, upd_num + 1);
#endif
			upd_num++;
			}

		exit (0);
		}

	/**
	** actual data generation section starts here
	**/
/*
 * open database connection or set all the file names, as appropriate
 */
	if (direct)
		prep_direct ((db_name) ? db_name : DBNAME);
	else if (fnames)
		for (i = PART; i <= REGION; i++)
		{
			if (table & (1 << i))
				if (set_files (i, -1))
				{
					fprintf (stderr, "Load aborted!\n");
					exit (1);
				}
		}

/*
 * traverse the tables, invoking the appropriate data generation routine for any to be built
 */
	for (i = PART; i <= REGION; i++)
		if (table & (1 << i))
		{
			if (children > 1 && i < NATION)
			{
				if (step >= 0)
				{
					if (validate)
					{
						INTERNAL_ERROR("Cannot validate parallel data generation");
					}
					else
						partial (i, step);
				}
#ifdef CAN_PARALLELIZE_DATA_GENERATION
				else
				{
					if (validate)
					{
						INTERNAL_ERROR("Cannot validate parallel data generation");
					}
					else
						pload(i);
				}
#else
				else
				{
					fprintf(stderr,
						"Parallel load is not supported on your platform currently.\n");
					exit(1);
				}
#endif /* CAN_PARALLELIZE_DATA_GENERATION */
			}
			else
			{
				minrow = 1;
				if (i < NATION)
					rowcnt = tdefs[i].base * scale;
				else
					rowcnt = tdefs[i].base;
#ifdef SSB
				if(i==PART){
					rowcnt = (DSS_HUGE) (tdefs[i].base * (floor(1+log((double)(scale))/(log(2)))));
				}
				if(i==DATE){
					rowcnt = tdefs[i].base;
				}
#endif
				if (verbose > 0)
					fprintf (stderr, "%s data for %s [pid: %d]: ",
					(validate)?"Validating":"Generating", tdefs[i].comment, DSS_PROC);
				gen_tbl (i, minrow, rowcnt, upd_num);
				if (verbose > 0)
					fprintf (stderr, "done.\n");
			}
			if (validate)
				printf("Validation checksum for %s at %ld GB: %0lx\n",
					 tdefs[i].name, scale, tdefs[i].vtotal);
		}

		if (direct)
			close_direct ();

		return (0);
}